

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O0

bool __thiscall QSQLiteResult::prepare(QSQLiteResult *this,QString *query)

{
  bool bVar1;
  int iVar2;
  QSQLiteResultPrivate *this_00;
  long lVar3;
  long *plVar4;
  ulong uVar5;
  QSQLiteDriverPrivate *pQVar6;
  EVP_PKEY_CTX *in_RSI;
  EVP_PKEY_CTX *ctx;
  QString *in_RDI;
  long in_FS_OFFSET;
  int res;
  int size;
  QSQLiteResultPrivate *d;
  void *pzTail;
  QString *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  sqlite3_stmt **in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff34;
  byte bVar8;
  uint uVar7;
  void *in_stack_ffffffffffffff38;
  sqlite3 *db;
  undefined6 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff56;
  byte bVar9;
  undefined1 in_stack_ffffffffffffff57;
  byte bVar10;
  bool local_81;
  char local_80 [24];
  QSqlError local_68 [8];
  QString local_60 [2];
  char local_30 [24];
  QSqlError local_18 [8];
  QChar *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ctx = in_RSI;
  this_00 = d_func((QSQLiteResult *)0x1156b5);
  lVar3 = QSqlResult::driver();
  if (lVar3 != 0) {
    plVar4 = (long *)QSqlResult::driver();
    uVar5 = (**(code **)(*plVar4 + 0x60))();
    if ((uVar5 & 1) != 0) {
      QSqlResult::driver();
      uVar5 = QSqlDriver::isOpenError();
      if ((uVar5 & 1) == 0) {
        QSQLiteResultPrivate::cleanup(this_00,ctx);
        (*(code *)(in_RDI->d).d[3].super_QArrayData.alloc)(in_RDI,0);
        local_10 = (QChar *)0x0;
        QString::size((QString *)in_RSI);
        pQVar6 = QSQLiteResultPrivate::drv_d_func
                           ((QSQLiteResultPrivate *)
                            CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
        db = pQVar6->access;
        QString::constData((QString *)0x11575d);
        iVar2 = sqlite3_prepare16_v2
                          (db,in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
                           in_stack_ffffffffffffff28,
                           (void **)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
        if (iVar2 == 0) {
          bVar10 = 0;
          bVar9 = 0;
          bVar8 = 0;
          if (local_10 != (QChar *)0x0) {
            QString::QString(local_60,local_10,-1);
            bVar10 = 1;
            QString::trimmed(in_stack_ffffffffffffff18);
            bVar9 = 1;
            bVar1 = QString::isEmpty((QString *)0x115897);
            bVar8 = bVar1 ^ 0xff;
          }
          uVar7 = (uint)CONCAT11(bVar8,bVar8) << 0x10;
          if ((bVar9 & 1) != 0) {
            QString::~QString((QString *)0x1158bb);
          }
          if ((bVar10 & 1) != 0) {
            QString::~QString((QString *)0x1158d1);
          }
          if ((uVar7 & 0x10000) == 0) {
            local_81 = true;
          }
          else {
            QSQLiteResultPrivate::drv_d_func
                      ((QSQLiteResultPrivate *)
                       CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
            QCoreApplication::translate
                      (local_80,"QSQLiteResult","Unable to execute multiple statements at a time",0)
            ;
            qMakeError((sqlite3 *)CONCAT17(bVar10,CONCAT16(bVar9,in_stack_ffffffffffffff50)),in_RDI,
                       (ErrorType)((ulong)db >> 0x20),(int)db);
            (*(code *)(in_RDI->d).d[2].super_QArrayData.alloc)(in_RDI,local_68);
            QSqlError::~QSqlError(local_68);
            QString::~QString((QString *)0x115962);
            QSQLiteResultPrivate::finalize
                      ((QSQLiteResultPrivate *)
                       CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
            local_81 = false;
          }
        }
        else {
          QSQLiteResultPrivate::drv_d_func
                    ((QSQLiteResultPrivate *)
                     CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
          QCoreApplication::translate(local_30,"QSQLiteResult","Unable to execute statement",0);
          qMakeError((sqlite3 *)
                     CONCAT17(in_stack_ffffffffffffff57,
                              CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)),in_RDI,
                     (ErrorType)((ulong)db >> 0x20),(int)db);
          (*(code *)(in_RDI->d).d[2].super_QArrayData.alloc)(in_RDI,local_18);
          QSqlError::~QSqlError(local_18);
          QString::~QString((QString *)0x11581d);
          QSQLiteResultPrivate::finalize
                    ((QSQLiteResultPrivate *)
                     CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
          local_81 = false;
        }
        goto LAB_0011597a;
      }
    }
  }
  local_81 = false;
LAB_0011597a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_81;
}

Assistant:

bool QSQLiteResult::prepare(const QString &query)
{
    Q_D(QSQLiteResult);
    if (!driver() || !driver()->isOpen() || driver()->isOpenError())
        return false;

    d->cleanup();

    setSelect(false);

    const void *pzTail = nullptr;
    const auto size = int((query.size() + 1) * sizeof(QChar));

#if (SQLITE_VERSION_NUMBER >= 3003011)
    int res = sqlite3_prepare16_v2(d->drv_d_func()->access, query.constData(), size,
                                   &d->stmt, &pzTail);
#else
    int res = sqlite3_prepare16(d->access, query.constData(), size,
                                &d->stmt, &pzTail);
#endif

    if (res != SQLITE_OK) {
        setLastError(qMakeError(d->drv_d_func()->access, QCoreApplication::translate("QSQLiteResult",
                     "Unable to execute statement"), QSqlError::StatementError, res));
        d->finalize();
        return false;
    } else if (pzTail && !QString(reinterpret_cast<const QChar *>(pzTail)).trimmed().isEmpty()) {
        setLastError(qMakeError(d->drv_d_func()->access, QCoreApplication::translate("QSQLiteResult",
            "Unable to execute multiple statements at a time"), QSqlError::StatementError, SQLITE_MISUSE));
        d->finalize();
        return false;
    }
    return true;
}